

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O1

void vprint_error(char *format,__va_list_tag *args)

{
  long in_FS_OFFSET;
  char buffer [1024];
  char acStack_418 [1024];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  vsnprintf(acStack_418,0x400,format,args);
  fputs(acStack_418,_stderr);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    fflush(_stderr);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void vprint_error(const char* const format, va_list args) {
    char buffer[1024];
    vsnprintf(buffer, sizeof(buffer), format, args);
    fprintf(stderr, "%s", buffer);
    fflush(stderr);
#ifdef _WIN32
    OutputDebugString(buffer);
#endif /* _WIN32 */
}